

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O1

void __thiscall PcodeOpBank::clear(PcodeOpBank *this)

{
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar1;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar2;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  plVar1 = &this->alivelist;
  for (p_Var5 = (this->alivelist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)plVar1;
      p_Var5 = p_Var5->_M_next) {
    p_Var4 = p_Var5[1]._M_next;
    if (p_Var4 != (_List_node_base *)0x0) {
      if (p_Var4[5]._M_next != (_List_node_base *)0x0) {
        operator_delete(p_Var4[5]._M_next);
      }
      operator_delete(p_Var4);
    }
  }
  plVar2 = &this->deadlist;
  for (p_Var5 = (this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)plVar2;
      p_Var5 = p_Var5->_M_next) {
    p_Var4 = p_Var5[1]._M_next;
    if (p_Var4 != (_List_node_base *)0x0) {
      if (p_Var4[5]._M_next != (_List_node_base *)0x0) {
        operator_delete(p_Var4[5]._M_next);
      }
      operator_delete(p_Var4);
    }
  }
  plVar3 = &this->deadandgone;
  for (p_Var5 = (this->deadandgone).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)plVar3;
      p_Var5 = p_Var5->_M_next) {
    p_Var4 = p_Var5[1]._M_next;
    if (p_Var4 != (_List_node_base *)0x0) {
      if (p_Var4[5]._M_next != (_List_node_base *)0x0) {
        operator_delete(p_Var4[5]._M_next);
      }
      operator_delete(p_Var4);
    }
  }
  std::
  _Rb_tree<SeqNum,_std::pair<const_SeqNum,_PcodeOp_*>,_std::_Select1st<std::pair<const_SeqNum,_PcodeOp_*>_>,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
  ::clear((_Rb_tree<SeqNum,_std::pair<const_SeqNum,_PcodeOp_*>,_std::_Select1st<std::pair<const_SeqNum,_PcodeOp_*>_>,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
           *)this);
  p_Var5 = (this->alivelist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)plVar1) {
    p_Var4 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var4;
  }
  (this->alivelist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->alivelist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->alivelist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node._M_size
       = 0;
  p_Var5 = (this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)plVar2) {
    p_Var4 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var4;
  }
  (this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node._M_size =
       0;
  clearCodeLists(this);
  p_Var5 = (this->deadandgone).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)plVar3) {
    p_Var4 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var4;
  }
  (this->deadandgone).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar3;
  (this->deadandgone).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar3;
  (this->deadandgone).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
  _M_size = 0;
  this->uniqid = 0;
  return;
}

Assistant:

void PcodeOpBank::clear(void)

{
  list<PcodeOp *>::iterator iter;

  for(iter=alivelist.begin();iter!=alivelist.end();++iter)
    delete *iter;
  for(iter=deadlist.begin();iter!=deadlist.end();++iter)
    delete *iter;
  for(iter=deadandgone.begin();iter!=deadandgone.end();++iter)
    delete *iter;
  optree.clear();
  alivelist.clear();
  deadlist.clear();
  clearCodeLists();
  deadandgone.clear();
  uniqid = 0;
}